

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_budget(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  envy_bios_power_budget_entry *peVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  uVar11 = (bios->power).budget.offset;
  if (uVar11 == 0) {
    return -0x16;
  }
  bios_u8(bios,uVar11,&(bios->power).budget.version);
  uVar9 = (ulong)(bios->power).budget.version;
  if ((0x30 < uVar9) || ((0x1000100010000U >> (uVar9 & 0x3f) & 1) == 0)) {
    fprintf(_stderr,"Unknown POWER BUDGET table version 0x%x\n");
    return -0x16;
  }
  iVar2 = bios_u8(bios,(bios->power).budget.offset + 1,&(bios->power).budget.hlen);
  iVar3 = bios_u8(bios,(bios->power).budget.offset + 2,&(bios->power).budget.rlen);
  iVar4 = bios_u8(bios,(bios->power).budget.offset + 3,&(bios->power).budget.entriesnum);
  (bios->power).budget.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
  uVar1 = (bios->power).budget.version;
  if (uVar1 == ' ') {
    iVar2 = 9;
  }
  else {
    if (uVar1 != '0') goto LAB_002592d3;
    iVar2 = 10;
  }
  bios_u8(bios,iVar2 + (bios->power).budget.offset,&(bios->power).budget.cap_entry);
LAB_002592d3:
  uVar13 = (ulong)(bios->power).budget.entriesnum;
  peVar8 = (envy_bios_power_budget_entry *)calloc(1,uVar13 * 0x18);
  (bios->power).budget.entries = peVar8;
  lVar12 = 0xc;
  uVar11 = 0;
  for (uVar9 = 0; uVar9 < uVar13; uVar9 = uVar9 + 1) {
    iVar3 = (uint)(bios->power).budget.hlen + (bios->power).budget.offset;
    uVar5 = (uint)(bios->power).budget.rlen;
    iVar4 = (int)uVar9 * uVar5;
    iVar2 = iVar3 + iVar4;
    *(int *)((long)peVar8 + lVar12 + -0xc) = iVar2;
    uVar10 = iVar4 + iVar3 + 2;
    if (uVar5 == 6) {
      uVar5 = bios_u32(bios,uVar10,(uint32_t *)((long)&peVar8->offset + lVar12));
    }
    else {
      uVar5 = bios_u32(bios,uVar10,(uint32_t *)((long)peVar8 + lVar12 + -4));
      uVar10 = bios_u32(bios,iVar2 + 6,
                        (uint32_t *)((long)&((bios->power).budget.entries)->offset + lVar12));
      uVar6 = bios_u32(bios,iVar2 + 10,(uint32_t *)(&((bios->power).budget.entries)->valid + lVar12)
                      );
      uVar7 = bios_u32(bios,iVar2 + 0x12,
                       (uint32_t *)((long)&((bios->power).budget.entries)->min + lVar12));
      uVar5 = uVar7 | uVar6 | uVar10 | uVar5;
    }
    uVar11 = uVar11 | uVar5;
    peVar8 = (bios->power).budget.entries;
    *(bool *)((long)peVar8 + lVar12 + -8) = uVar11 == 0;
    uVar13 = (ulong)(bios->power).budget.entriesnum;
    lVar12 = lVar12 + 0x18;
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_budget(struct envy_bios *bios) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i, err = 0;

	if (!budget->offset)
		return -EINVAL;

	bios_u8(bios, budget->offset + 0x0, &budget->version);

	switch(budget->version) {
	case 0x10:
	case 0x20:
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0x1, &budget->hlen);
		err |= bios_u8(bios, budget->offset + 0x2, &budget->rlen);
		err |= bios_u8(bios, budget->offset + 0x3, &budget->entriesnum);
		budget->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER BUDGET table version 0x%x\n", budget->version);
		return -EINVAL;
	};

	switch(budget->version) {
	case 0x20:
		err |= bios_u8(bios, budget->offset + 0x9, &budget->cap_entry);
		break;
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0xa, &budget->cap_entry);
		break;
	};

	err = 0;
	budget->entries = malloc(budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	memset(budget->entries, 0x0, budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	for (i = 0; i < budget->entriesnum; i++) {
		uint32_t data = budget->offset + budget->hlen + i * budget->rlen;

		budget->entries[i].offset = data;

		if (budget->rlen == 0x6) {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].avg);
		} else {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].min);
			err |= bios_u32(bios, data + 0x06, &budget->entries[i].avg);
			err |= bios_u32(bios, data + 0x0a, &budget->entries[i].peak);
			err |= bios_u32(bios, data + 0x12, &budget->entries[i].unkn12);
		}

		budget->entries[i].valid = !err;
	}

	return 0;
}